

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

Name __thiscall wasm::UniqueNameMapper::getPrefixedName(UniqueNameMapper *this,Name prefix)

{
  _Rb_tree_header *p_Var1;
  uint __val;
  IString IVar2;
  iterator iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  undefined1 auStack_68 [8];
  Name prefix_local;
  undefined1 auStack_48 [8];
  Name ret;
  
  prefix_local.super_IString.str._M_len = prefix.super_IString.str._M_str;
  auStack_68 = prefix.super_IString.str._M_len;
  prefix_local.super_IString.str._M_str = (char *)&this->reverseLabelMapping;
  iVar3 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  *)prefix_local.super_IString.str._M_str,(key_type *)auStack_68);
  p_Var1 = &(this->reverseLabelMapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    auStack_48 = auStack_68;
    ret.super_IString.str._M_len = prefix_local.super_IString.str._M_len;
  }
  else {
    do {
      IString::toString_abi_cxx11_(&local_a8,(IString *)auStack_68);
      __val = this->otherIndex;
      this->otherIndex = __val + 1;
      std::__cxx11::to_string(&local_88,__val);
      std::operator+(&local_c8,&local_a8,&local_88);
      IString::IString((IString *)auStack_48,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      iVar3 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      *)prefix_local.super_IString.str._M_str,(key_type *)auStack_48);
    } while ((_Rb_tree_header *)iVar3._M_node != p_Var1);
  }
  IVar2.str._M_str = (char *)ret.super_IString.str._M_len;
  IVar2.str._M_len = (size_t)auStack_48;
  return (IString)(IString)IVar2.str;
}

Assistant:

Name UniqueNameMapper::getPrefixedName(Name prefix) {
  if (reverseLabelMapping.find(prefix) == reverseLabelMapping.end()) {
    return prefix;
  }
  // make sure to return a unique name not already on the stack
  while (1) {
    Name ret = prefix.toString() + std::to_string(otherIndex++);
    if (reverseLabelMapping.find(ret) == reverseLabelMapping.end()) {
      return ret;
    }
  }
}